

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O3

LPCSTR __thiscall NpyArray::SaveNPY(NpyArray *this,string *filename,bool bAppend)

{
  pointer puVar1;
  FILE *__stream;
  char *pcVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  shape_t *shape;
  bool _fortranOrder;
  char _type;
  shape_t _shape;
  vector<char,_std::allocator<char>_> header;
  bool local_5a;
  char local_59;
  shape_t local_58;
  vector<char,_std::allocator<char>_> local_38;
  
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000011,bAppend) == 0) {
LAB_00116e02:
    __stream = fopen((filename->_M_dataplus)._M_p,"wb");
    shape = &this->shape;
  }
  else {
    __stream = fopen((filename->_M_dataplus)._M_p,"r+b");
    if (__stream == (FILE *)0x0) goto LAB_00116e02;
    shape = &local_58;
    pcVar2 = ParseHeaderNPY((FILE *)__stream,shape,(size_t *)&local_38,&local_59,&local_5a);
    if (pcVar2 != (LPCSTR)0x0) goto LAB_00116eac;
    if ((pointer)this->wordSize !=
        local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      pcVar2 = "error: npy_save word size";
      goto LAB_00116eac;
    }
    puVar1 = (this->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar4 = (long)(this->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    if (lVar4 != (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start) {
      pcVar2 = "error: npy_save attempting to append mis-dimensioned data";
      goto LAB_00116eac;
    }
    uVar5 = lVar4 >> 3;
    if (1 < uVar5) {
      uVar6 = 1;
      pcVar2 = "error: npy_save attempting to append misshaped data";
      do {
        if (puVar1[uVar6] !=
            local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6]) goto LAB_00116eac;
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    *local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start =
         *local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start + *puVar1;
  }
  if (__stream == (FILE *)0x0) {
    pcVar2 = "error: unable to open file";
  }
  else {
    bVar3 = this->type >> 7;
    CreateHeaderNPY(&local_38,shape,(this->type ^ bVar3) - bVar3,this->wordSize);
    fseek(__stream,0,0);
    fwrite(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,1,
           (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__stream);
    fseek(__stream,0,2);
    fwrite(this->data,this->wordSize,this->numValues,__stream);
    fclose(__stream);
    if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pcVar2 = (LPCSTR)0x0;
  }
LAB_00116eac:
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return pcVar2;
}

Assistant:

LPCSTR NpyArray::SaveNPY(std::string filename, bool bAppend) const
{
	FILE* fp;
	shape_t _shape;
	const shape_t* pShape;
	if (bAppend && (fp=fopen(filename.c_str(), "r+b")) != NULL) {
		// file exists, append to it; read the header, modify the array size
		char _type;
		size_t _wordSize;
		bool _fortranOrder;
		LPCSTR ret = ParseHeaderNPY(fp, _shape, _wordSize, _type, _fortranOrder);
		if (ret != NULL)
			return ret;
		ASSERT(!_fortranOrder);

		if (wordSize != _wordSize)
			return "error: npy_save word size";
		if (shape.size() != _shape.size())
			return "error: npy_save attempting to append mis-dimensioned data";

		for (size_t i = 1; i < shape.size(); i++) {
			if (shape[i] != _shape[i])
				return "error: npy_save attempting to append misshaped data";
		}
		_shape[0] += shape[0];
		pShape = &_shape;
	} else {
		// create a new file
		fp = fopen(filename.c_str(), "wb");
		pShape = &shape;
	}
	if (!fp)
		return "error: unable to open file";

	const std::vector<char> header = CreateHeaderNPY(*pShape, std::abs(type), wordSize);

	fseek(fp, 0, SEEK_SET);
	fwrite(header.data(), sizeof(char), header.size(), fp);
	fseek(fp, 0, SEEK_END);
	fwrite(Data(), wordSize, numValues, fp);
	fclose(fp);
	return NULL;
}